

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# goeslrit.cc
# Opt level: O0

string * filename_abi_cxx11_(unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>
                             *spdu)

{
  bool bVar1;
  _Setfill<char> _Var2;
  _Setw _Var3;
  ostream *poVar4;
  string *psVar5;
  string *in_RDI;
  stringstream suffix;
  SegmentIdentificationHeader sih;
  uint16_t pid;
  NOAALRITHeader nlh;
  PrimaryHeader ph;
  string *out;
  SessionPDU *in_stack_fffffffffffffda0;
  string local_210 [8];
  SessionPDU *in_stack_fffffffffffffdf8;
  stringstream local_1e8 [16];
  ostream local_1d8 [382];
  ushort local_5a;
  uint16_t local_4e;
  NOAALRITHeader local_4c;
  char local_2c;
  undefined1 local_11;
  
  local_11 = 0;
  std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>::operator->
            ((unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_> *)
             0x12e0e9);
  assembler::SessionPDU::getName_abi_cxx11_(in_stack_fffffffffffffdf8);
  std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>::operator->
            ((unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_> *)
             0x12e103);
  assembler::SessionPDU::getHeader<lrit::PrimaryHeader>(in_stack_fffffffffffffda0);
  std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>::operator->
            ((unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_> *)
             0x12e122);
  local_4c = assembler::SessionPDU::getHeader<lrit::NOAALRITHeader>((SessionPDU *)0x12e12a);
  local_4e = local_4c.productID;
  if ((local_2c == '\0') &&
     ((((local_4c.productID == 0x10 || (local_4c.productID == 0x11)) || (local_4c.productID == 0x12)
       ) || (local_4c.productID == 0x13)))) {
    std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>::operator->
              ((unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_> *)
               0x12e1b6);
    bVar1 = assembler::SessionPDU::hasHeader<lrit::SegmentIdentificationHeader>
                      ((SessionPDU *)0x12e1be);
    if (bVar1) {
      std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>::
      operator->((unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_> *)
                 0x12e1de);
      assembler::SessionPDU::getHeader<lrit::SegmentIdentificationHeader>(in_stack_fffffffffffffda0)
      ;
      std::__cxx11::stringstream::stringstream(local_1e8);
      poVar4 = std::operator<<(local_1d8,"_");
      _Var2 = std::setfill<char>('0');
      poVar4 = std::operator<<(poVar4,_Var2._M_c);
      _Var3 = std::setw(3);
      poVar4 = std::operator<<(poVar4,_Var3);
      std::ostream::operator<<(poVar4,local_5a);
      psVar5 = (string *)std::__cxx11::string::rfind((char *)in_RDI,0x18301a);
      std::__cxx11::stringstream::str();
      std::__cxx11::string::insert((ulong)in_RDI,psVar5);
      std::__cxx11::string::~string(local_210);
      std::__cxx11::stringstream::~stringstream(local_1e8);
    }
  }
  return in_RDI;
}

Assistant:

std::string filename(std::unique_ptr<assembler::SessionPDU>& spdu) {
  auto out = spdu->getName();
  auto ph = spdu->getHeader<lrit::PrimaryHeader>();
  auto nlh = spdu->getHeader<lrit::NOAALRITHeader>();
  auto pid = nlh.productID;

  // Special case GOES-R series.
  if (ph.fileType == 0 && (pid == 16 || pid == 17 || pid == 18 || pid == 19)) {
    // Some image files are segmented but have the same annotation.
    // To prevent overwriting earlier files, include the segment number.
    if (spdu->hasHeader<lrit::SegmentIdentificationHeader>()) {
      auto sih = spdu->getHeader<lrit::SegmentIdentificationHeader>();
      std::stringstream suffix;
      suffix << "_" << std::setfill('0') << std::setw(3) << sih.segmentNumber;
      out.insert(out.rfind(".lrit"), suffix.str());
    }
  }

  return out;
}